

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

FT_Error ps_dimension_add_t1stem
                   (PS_Dimension dim,FT_Int pos,FT_Int len,FT_Memory memory,FT_UInt *aindex)

{
  uint uVar1;
  PS_Hint pPVar2;
  ulong uVar3;
  FT_Int *pFVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  PS_Mask mask;
  int local_4c;
  FT_Memory local_48;
  PS_Mask local_40;
  FT_UInt *local_38;
  
  iVar5 = 0;
  if (0 < len) {
    iVar5 = len;
  }
  iVar9 = pos + -0x15;
  if (len != -0x15) {
    iVar9 = pos;
  }
  uVar8 = (dim->hints).num_hints;
  pPVar2 = (dim->hints).hints;
  bVar10 = uVar8 != 0;
  uVar7 = 0;
  local_38 = aindex;
  if (bVar10) {
    pFVar4 = &pPVar2->len;
    uVar6 = 0;
    do {
      if ((((PS_HintRec_ *)(pFVar4 + -1))->pos == iVar9) && (*pFVar4 == iVar5)) {
        uVar7 = uVar6;
        if (bVar10) goto LAB_0023e4be;
        break;
      }
      uVar6 = uVar6 + 1;
      bVar10 = uVar6 < uVar8;
      pFVar4 = pFVar4 + 3;
      uVar7 = uVar8;
    } while (uVar8 != uVar6);
  }
  uVar6 = uVar8 + 1;
  uVar1 = (dim->hints).max_hints;
  if (uVar1 < uVar6) {
    uVar8 = (uVar8 & 0xfffffff8) + 8;
    local_48 = memory;
    pPVar2 = (PS_Hint)ft_mem_qrealloc(memory,0xc,(ulong)uVar1,(ulong)uVar8,pPVar2,&local_4c);
    (dim->hints).hints = pPVar2;
    memory = local_48;
    if (local_4c != 0) {
      pPVar2 = (PS_Hint)0x0;
      goto LAB_0023e49f;
    }
    (dim->hints).max_hints = uVar8;
  }
  pPVar2 = (dim->hints).hints + ((ulong)uVar6 - 1);
  (dim->hints).num_hints = uVar6;
  local_4c = 0;
LAB_0023e49f:
  if (local_4c == 0) {
    pPVar2->pos = iVar9;
    pPVar2->len = iVar5;
    pPVar2->flags = len >> 0x1f & (uint)(len == -0x15) * 2 + 1;
    uVar6 = uVar7;
LAB_0023e4be:
    uVar3 = (ulong)(dim->masks).num_masks;
    if (uVar3 == 0) {
      local_4c = ps_mask_table_alloc(&dim->masks,memory,&local_40);
    }
    else {
      local_40 = (dim->masks).masks + (uVar3 - 1);
      local_4c = 0;
    }
    if (((local_4c == 0) && (local_4c = ps_mask_set_bit(local_40,uVar6,memory), local_4c == 0)) &&
       (local_4c = 0, local_38 != (FT_UInt *)0x0)) {
      *local_38 = uVar6;
    }
  }
  return local_4c;
}

Assistant:

static FT_Error
  ps_dimension_add_t1stem( PS_Dimension  dim,
                           FT_Int        pos,
                           FT_Int        len,
                           FT_Memory     memory,
                           FT_UInt      *aindex )
  {
    FT_Error  error = FT_Err_Ok;
    FT_UInt   flags = 0;


    /* detect ghost stem */
    if ( len < 0 )
    {
      flags |= PS_HINT_FLAG_GHOST;
      if ( len == -21 )
      {
        flags |= PS_HINT_FLAG_BOTTOM;
        pos    = ADD_INT( pos, len );
      }
      len = 0;
    }

    /* now, lookup stem in the current hints table */
    {
      PS_Mask  mask;
      FT_UInt  idx;
      FT_UInt  max  = dim->hints.num_hints;
      PS_Hint  hint = dim->hints.hints;


      for ( idx = 0; idx < max; idx++, hint++ )
      {
        if ( hint->pos == pos && hint->len == len )
          break;
      }

      /* we need to create a new hint in the table */
      if ( idx >= max )
      {
        error = ps_hint_table_alloc( &dim->hints, memory, &hint );
        if ( error )
          goto Exit;

        hint->pos   = pos;
        hint->len   = len;
        hint->flags = flags;
      }

      /* now, store the hint in the current mask */
      error = ps_mask_table_last( &dim->masks, memory, &mask );
      if ( error )
        goto Exit;

      error = ps_mask_set_bit( mask, idx, memory );
      if ( error )
        goto Exit;

      if ( aindex )
        *aindex = idx;
    }

  Exit:
    return error;
  }